

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               ImGuiSliderFlags flags)

{
  undefined1 auVar1 [16];
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  ImGuiInputSource IVar5;
  int iVar6;
  float *pfVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  float fVar11;
  undefined1 in_register_00001204 [60];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  float local_7c;
  float local_68;
  ImVec2 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  pIVar2 = GImGui;
  auVar16._4_60_ = in_register_00001204;
  auVar16._0_4_ = v_speed;
  auVar16 = ZEXT1664(auVar16._0_16_);
  uVar4 = data_type & 0xfffffffe;
  uVar8 = v_max - v_min;
  if (v_speed == 0.0 && (v_min <= v_max && uVar8 != 0)) {
    auVar16 = ZEXT464((uint)((float)uVar8 * GImGui->DragSpeedDefaultRatio));
  }
  uVar10 = (flags & 0x100000U) >> 0x14;
  IVar5 = GImGui->ActiveIdSource;
  auVar15 = auVar16._0_16_;
  if (IVar5 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) ||
       (bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), !bVar3)) {
      IVar5 = pIVar2->ActiveIdSource;
      auVar16 = ZEXT1664(auVar15);
      goto LAB_001705bc;
    }
    pfVar7 = ImVec2::operator[](&(pIVar2->IO).MouseDelta,(ulong)uVar10);
    fVar11 = *pfVar7;
    if ((pIVar2->IO).KeyAlt != false) {
      fVar11 = fVar11 * 0.01;
    }
    fVar14 = auVar16._0_4_;
    if ((pIVar2->IO).KeyShift != false) {
      fVar11 = fVar11 * 10.0;
    }
  }
  else {
LAB_001705bc:
    fVar14 = auVar16._0_4_;
    fVar11 = 0.0;
    if (IVar5 == ImGuiInputSource_Nav) {
      iVar6 = 0;
      if (uVar4 == 8) {
        iVar6 = ImParseFormatPrecision(format,3);
      }
      auVar12._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar12._8_56_ = extraout_var_00;
      local_38 = (ImVec2)vmovlps_avx(auVar12._0_16_);
      pfVar7 = ImVec2::operator[](&local_38,(ulong)uVar10);
      fVar11 = *pfVar7;
      auVar13._0_4_ = GetMinimumStepAtDecimalPrecision(iVar6);
      auVar13._4_60_ = extraout_var;
      auVar1 = vcmpss_avx(auVar13._0_16_,auVar15,2);
      auVar15 = vblendvps_avx(auVar13._0_16_,auVar15,auVar1);
      fVar14 = auVar15._0_4_;
    }
  }
  bVar9 = uVar4 == 8 & (byte)((flags & 0x20U) >> 5);
  fVar11 = fVar11 * fVar14;
  if ((flags & 0x100000U) != 0) {
    fVar11 = -fVar11;
  }
  fVar14 = fVar11;
  if (bVar9 != 0) {
    fVar14 = fVar11 / (float)uVar8;
  }
  bVar3 = false;
  if (v_max == v_min) {
    fVar14 = fVar11;
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar14)) goto LAB_001706e8;
    bVar3 = fVar14 < 0.0 && *v <= v_min;
  }
  if ((pIVar2->ActiveIdIsJustActivated == false) && (!bVar3)) {
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      pIVar2->DragCurrentAccum = fVar14 + pIVar2->DragCurrentAccum;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    uVar8 = *v;
    if (bVar9 == 0) {
      uVar8 = uVar8 + (int)pIVar2->DragCurrentAccum;
      local_7c = 0.0;
      local_68 = 0.0;
    }
    else {
      iVar6 = ImParseFormatPrecision(format,3);
      local_68 = powf(0.1,(float)iVar6);
      local_7c = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,uVar8,v_min,v_max,true,local_68,0.0);
      uVar8 = ScaleValueFromRatioT<unsigned_int,int,float>
                        (data_type,local_7c + pIVar2->DragCurrentAccum,v_min,v_max,true,local_68,0.0
                        );
    }
    if ((flags & 0x40U) == 0) {
      uVar8 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar8);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if (bVar9 == 0) {
      uVar10 = *v;
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(int)(uVar8 - uVar10);
    }
    else {
      fVar11 = ScaleRatioFromValueT<unsigned_int,int,float>
                         (data_type,uVar8,v_min,v_max,true,local_68,0.0);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (fVar11 - local_7c);
      uVar10 = *v;
    }
    if ((v_min < v_max) && (uVar10 != uVar8)) {
      if ((uVar8 < v_min) || (((uVar4 != 8 && (uVar10 < uVar8)) && (fVar14 < 0.0)))) {
        uVar8 = v_min;
      }
      if ((v_max < uVar8) || (((uVar4 != 8 && (uVar8 < uVar10)) && (0.0 < fVar14)))) {
        uVar8 = v_max;
      }
    }
    if (uVar10 == uVar8) {
      return false;
    }
    *v = uVar8;
    return true;
  }
LAB_001706e8:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}